

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale.cpp
# Opt level: O1

GroupSizes __thiscall QLocaleData::groupSizes(QLocaleData *this)

{
  bool bVar1;
  bool bVar2;
  QSystemLocale *pQVar3;
  QMetaType fromType;
  ulong unaff_R12;
  ulong unaff_R13;
  uint uVar4;
  anon_union_24_3_e3d07ef4_for_data *paVar5;
  anon_union_24_3_e3d07ef4_for_data *this_00;
  long in_FS_OFFSET;
  GroupSizes GVar6;
  GroupSizes t;
  QMetaType local_80;
  anon_union_24_3_e3d07ef4_for_data local_78;
  undefined8 local_60;
  anon_union_24_3_e3d07ef4_for_data local_58;
  undefined1 *puStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (this == &systemLocaleData) {
    paVar5 = &local_58;
    local_58._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
    puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
    local_58.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
    local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    pQVar3 = systemLocale();
    local_78.shared = (PrivateShared *)0x0;
    local_78._8_8_ = 0;
    local_78._16_8_ = 0;
    local_60 = 2;
    (*pQVar3->_vptr_QSystemLocale[2])(paVar5,pQVar3,3);
    ::QVariant::~QVariant((QVariant *)&local_78);
    this_00 = &local_58;
    bVar1 = ::QVariant::isNull((QVariant *)this_00);
    if (!bVar1) {
      local_80.d_ptr = &QtPrivate::QMetaTypeInterfaceWrapper<QLocaleData::GroupSizes>::metaType;
      local_78.shared = (PrivateShared *)((ulong)puStack_40 & 0xfffffffffffffffc);
      bVar2 = ::comparesEqual((QMetaType *)&local_78.shared,&local_80);
      if (bVar2) {
        if (((ulong)puStack_40 & 1) != 0) {
          this_00 = (anon_union_24_3_e3d07ef4_for_data *)
                    ((long)&((local_58.shared)->ref).super_QAtomicInteger<int>.
                            super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i +
                    (long)(local_58.shared)->offset);
        }
        local_78._8_4_ = *(undefined4 *)((long)this_00 + 8);
        local_78.shared = (PrivateShared *)*(undefined8 *)this_00;
      }
      else {
        local_78.shared = (PrivateShared *)0x0;
        local_78._8_8_ = (ulong)(uint)local_78._12_4_ << 0x20;
        paVar5 = &local_58;
        fromType = ::QVariant::metaType((QVariant *)paVar5);
        if (((ulong)puStack_40 & 1) != 0) {
          paVar5 = (anon_union_24_3_e3d07ef4_for_data *)
                   ((long)&((local_58.shared)->ref).super_QAtomicInteger<int>.
                           super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i +
                   (long)(local_58.shared)->offset);
        }
        QMetaType::convert(fromType,paVar5,local_80,&local_78);
      }
      unaff_R12 = (ulong)((uint)systemLocaleData._120_4_ >> 0xe & 3);
      if (0 < (int)local_78.shared) {
        unaff_R12 = (ulong)local_78.shared & 0xffffffff;
      }
      unaff_R13 = (ulong)((uint)systemLocaleData._120_4_ >> 0x10 & 7);
      if ((int)((ulong)local_78._0_8_ >> 0x20) != 0 && -1 < (long)local_78.shared) {
        unaff_R13 = (ulong)local_78.shared >> 0x20;
      }
      paVar5 = (anon_union_24_3_e3d07ef4_for_data *)
               (ulong)((uint)systemLocaleData._120_4_ >> 0x13 & 7);
      if (0 < (int)local_78._8_4_) {
        paVar5 = (anon_union_24_3_e3d07ef4_for_data *)(local_78._8_8_ & 0xffffffff);
      }
    }
    uVar4 = (uint)paVar5;
    ::QVariant::~QVariant((QVariant *)&local_58);
    if (!bVar1) goto LAB_0030fc62;
  }
  uVar4 = *(uint *)&this->field_0x78;
  unaff_R12 = (ulong)(uVar4 >> 0xe & 3);
  unaff_R13 = (ulong)(uVar4 >> 0x10 & 7);
  uVar4 = uVar4 >> 0x13 & 7;
LAB_0030fc62:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    GVar6._0_8_ = unaff_R12 & 0xffffffff | unaff_R13 << 0x20;
    GVar6.least = uVar4;
    return GVar6;
  }
  __stack_chk_fail();
}

Assistant:

QLocaleData::GroupSizes QLocaleData::groupSizes() const
{
#ifndef QT_NO_SYSTEMLOCALE
    if (this == &systemLocaleData) {
        QVariant queryResult = systemLocale()->query(QSystemLocale::Grouping);
        if (!queryResult.isNull()) {
            QLocaleData::GroupSizes sysGroupSizes =
                    queryResult.value<QLocaleData::GroupSizes>();
            if (sysGroupSizes.first <= 0)
                sysGroupSizes.first = m_grouping_first;
            if (sysGroupSizes.higher <= 0)
                sysGroupSizes.higher = m_grouping_higher;
            if (sysGroupSizes.least <= 0)
                sysGroupSizes.least = m_grouping_least;
            return sysGroupSizes;
        }
    }
#endif
    return { m_grouping_first,
             m_grouping_higher,
             m_grouping_least };
}